

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

bool __thiscall
TSMuxer::appendM2TSNullPacketToFile
          (TSMuxer *this,int64_t curFileSize,int counter,int *packetsWrited)

{
  int iVar1;
  ssize_t sVar2;
  int *__nbytes;
  File *local_130;
  long local_118;
  int64_t newFileSize;
  TSPacket *tsPacket;
  int readCnt;
  File *file;
  uint8_t tmpBuff [192];
  int *packetsWrited_local;
  int counter_local;
  int64_t curFileSize_local;
  TSMuxer *this_local;
  
  *packetsWrited = 0;
  for (packetsWrited_local._4_4_ = counter; (int)packetsWrited_local._4_4_ < 0;
      packetsWrited_local._4_4_ = packetsWrited_local._4_4_ + 0x10) {
  }
  if (this->m_muxFile == (AbstractOutputStream *)0x0) {
    local_130 = (File *)0x0;
    __nbytes = packetsWrited;
  }
  else {
    __nbytes = (int *)0x0;
    local_130 = (File *)__dynamic_cast(this->m_muxFile,&AbstractOutputStream::typeinfo,
                                       &File::typeinfo);
  }
  File::seek(local_130,curFileSize + -0xc0,smBegin);
  sVar2 = File::read(local_130,(int)&file,(void *)0xc0,(size_t)__nbytes);
  if ((int)sVar2 == 0xc0) {
    memcpy((void *)((long)&file + 4),this->m_nullBuffer,0xbc);
    for (local_118 = curFileSize; local_118 % 0x1800 != 0; local_118 = local_118 + 0xc0) {
      file._0_4_ = (uint)file & 0xf0ffffff | (packetsWrited_local._4_4_ & 0xf) << 0x18;
      iVar1 = (*(local_130->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5]
              )(local_130,&file,0xc0);
      if (iVar1 != 0xc0) {
        return false;
      }
      *packetsWrited = *packetsWrited + 1;
      packetsWrited_local._4_4_ = packetsWrited_local._4_4_ + 1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TSMuxer::appendM2TSNullPacketToFile(const int64_t curFileSize, int counter, int* packetsWrited) const
{
    *packetsWrited = 0;
    while (counter < 0) counter += 16;
    uint8_t tmpBuff[192];

    File* file = dynamic_cast<File*>(m_muxFile);

    file->seek(curFileSize - 192, File::SeekMethod::smBegin);
    const int readCnt = file->read(tmpBuff, 192);
    if (readCnt != 192)
        return false;
    memcpy(tmpBuff + 4, m_nullBuffer, TS_FRAME_SIZE);
    const auto tsPacket = reinterpret_cast<TSPacket*>(tmpBuff);
    for (int64_t newFileSize = curFileSize; newFileSize % (2048LL * 3) != 0; newFileSize += 192)
    {
        tsPacket->counter = counter++;
        if (file->write(tmpBuff, 192) != 192)
            return false;
        // m_muxedPacketCnt[m_muxedPacketCnt.size()-1]++;
        (*packetsWrited)++;
    }
    return true;
}